

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-interp.cc
# Opt level: O0

Result __thiscall
wabt::interp::anon_unknown_1::BinaryReaderInterp::BeginFunctionBody
          (BinaryReaderInterp *this,Index index,Offset size)

{
  FuncDesc *pFVar1;
  bool bVar2;
  Index IVar3;
  Offset OVar4;
  reference pvVar5;
  size_type sVar6;
  value_type local_88;
  Location local_50;
  Enum local_30;
  uint local_2c;
  Offset OStack_28;
  Index defined_index;
  Offset size_local;
  BinaryReaderInterp *pBStack_18;
  Index index_local;
  BinaryReaderInterp *this_local;
  
  OStack_28 = size;
  size_local._4_4_ = index;
  pBStack_18 = this;
  IVar3 = num_func_imports(this);
  local_2c = index - IVar3;
  pvVar5 = std::vector<wabt::interp::FuncDesc,_std::allocator<wabt::interp::FuncDesc>_>::operator[]
                     (&this->module_->funcs,(ulong)local_2c);
  this->func_ = pvVar5;
  OVar4 = Istream::end(this->istream_);
  this->func_->code_offset = OVar4;
  FixupMap::Clear(&this->depth_fixups_);
  std::
  vector<wabt::interp::(anonymous_namespace)::Label,_std::allocator<wabt::interp::(anonymous_namespace)::Label>_>
  ::clear(&this->label_stack_);
  FixupMap::Resolve(&this->func_fixups_,this->istream_,local_2c);
  GetLocation(&local_50,this);
  local_30 = (Enum)SharedValidator::BeginFunctionBody(&this->validator_,&local_50,size_local._4_4_);
  bVar2 = Failed((Result)local_30);
  if (bVar2) {
    Result::Result((Result *)((long)&this_local + 4),Error);
  }
  else {
    sVar6 = std::vector<wabt::interp::HandlerDesc,_std::allocator<wabt::interp::HandlerDesc>_>::size
                      (&this->func_->handlers);
    PushLabel(this,Try,0xffffffff,0xffffffff,(u32)sVar6);
    pFVar1 = this->func_;
    local_88.kind = Catch;
    local_88.try_start_offset = Istream::end(this->istream_);
    local_88.try_end_offset = 0xffffffff;
    memset(&local_88.catches,0,0x18);
    std::vector<wabt::interp::CatchDesc,_std::allocator<wabt::interp::CatchDesc>_>::vector
              (&local_88.catches);
    local_88.field_4.catch_all_offset = 0xffffffff;
    sVar6 = std::vector<wabt::interp::LocalDesc,_std::allocator<wabt::interp::LocalDesc>_>::size
                      (&this->func_->locals);
    local_88.values = (u32)sVar6;
    local_88.exceptions = 0;
    std::vector<wabt::interp::HandlerDesc,_std::allocator<wabt::interp::HandlerDesc>_>::push_back
              (&pFVar1->handlers,&local_88);
    HandlerDesc::~HandlerDesc(&local_88);
    Result::Result((Result *)((long)&this_local + 4),Ok);
  }
  return (Result)this_local._4_4_;
}

Assistant:

Result BinaryReaderInterp::BeginFunctionBody(Index index, Offset size) {
  Index defined_index = index - num_func_imports();
  func_ = &module_.funcs[defined_index];
  func_->code_offset = istream_.end();

  depth_fixups_.Clear();
  label_stack_.clear();

  func_fixups_.Resolve(istream_, defined_index);

  CHECK_RESULT(validator_.BeginFunctionBody(GetLocation(), index));

  // Push implicit func label (equivalent to return).
  // With exception handling it acts as a catch-less try block, which is
  // needed to support delegating to the caller of a function using the
  // try-delegate instruction.
  PushLabel(LabelKind::Try, Istream::kInvalidOffset, Istream::kInvalidOffset,
            func_->handlers.size());
  func_->handlers.push_back(HandlerDesc{HandlerKind::Catch,
                                        istream_.end(),
                                        Istream::kInvalidOffset,
                                        {},
                                        {Istream::kInvalidOffset},
                                        static_cast<u32>(func_->locals.size()),
                                        0});
  return Result::Ok;
}